

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMap.hpp
# Opt level: O0

void __thiscall Lib::ArrayMap<Kernel::TermList>::reset(ArrayMap<Kernel::TermList> *this)

{
  ArrayMapEntry<Kernel::TermList> *pAVar1;
  size_t sVar2;
  Entry *afterLast;
  Entry *nptr;
  ArrayMap<Kernel::TermList> *this_local;
  
  this->_timestamp = this->_timestamp + 1;
  if (this->_timestamp == 0) {
    pAVar1 = (this->super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>)._array;
    sVar2 = (this->super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>)._capacity;
    nptr = (this->super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>)._array;
    while (nptr != pAVar1 + sVar2) {
      nptr->_timestamp = 0;
      nptr = nptr + 1;
    }
    this->_timestamp = 1;
  }
  return;
}

Assistant:

void reset()
  {
    _timestamp++;
    if(_timestamp==0) {
      Entry* nptr=DArray<Entry>::_array;
      Entry* afterLast=DArray<Entry>::_array +DArray<Entry>::_capacity;
      while(nptr!=afterLast) {
        (nptr++)->_timestamp=0;
      }
      _timestamp=1;
    }
  }